

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O2

int ffi2fi2(short *input,long ntodo,double scale,double zero,short *output,int *status)

{
  long lVar1;
  short sVar2;
  double dVar3;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    lVar1 = 0;
    if (ntodo < 1) {
      ntodo = lVar1;
    }
    for (; ntodo != lVar1; lVar1 = lVar1 + 1) {
      dVar3 = ((double)(int)input[lVar1] - zero) / scale;
      if (-32768.49 <= dVar3) {
        if (dVar3 <= 32767.49) {
          if (0.0 <= dVar3) {
            dVar3 = dVar3 + 0.5;
          }
          else {
            dVar3 = dVar3 + -0.5;
          }
          sVar2 = (short)(int)dVar3;
        }
        else {
          *status = -0xb;
          sVar2 = 0x7fff;
        }
      }
      else {
        *status = -0xb;
        sVar2 = -0x8000;
      }
      output[lVar1] = sVar2;
    }
  }
  else {
    memcpy(output,input,ntodo * 2);
  }
  return *status;
}

Assistant:

int ffi2fi2(short *input,       /* I - array of values to be converted  */
            long ntodo,         /* I - number of elements in the array  */
            double scale,       /* I - FITS TSCALn or BSCALE value      */
            double zero,        /* I - FITS TZEROn or BZERO  value      */
            short *output,      /* O - output array of converted values */
            int *status)        /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        memcpy(output, input, ntodo * sizeof(short) );
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}